

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall
cli::Parser::set_optional<std::__cxx11::string>
          (Parser *this,string *name,string *alternative,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue,
          string *description)

{
  pointer *pppCVar1;
  iterator __position;
  CmdBase *this_00;
  CmdBase *local_38;
  
  this_00 = (CmdBase *)operator_new(200);
  CmdBase::CmdBase(this_00,name,alternative,description,false);
  this_00->_vptr_CmdBase = (_func_int **)&PTR__CmdArgument_00125860;
  this_00[1]._vptr_CmdBase = (_func_int **)&this_00[1].name._M_string_length;
  this_00[1].name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&this_00[1].name._M_string_length = 0;
  std::__cxx11::string::_M_assign((string *)(this_00 + 1));
  __position._M_current =
       (this->_commands).
       super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_commands).
      super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = this_00;
    std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
    _M_realloc_insert<cli::Parser::CmdBase*>
              ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)
               &this->_commands,__position,&local_38);
  }
  else {
    *__position._M_current = this_00;
    pppCVar1 = &(this->_commands).
                super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "") {
			auto command = new CmdArgument<T> { name, alternative, description, false };
			command->value = defaultValue;
			_commands.push_back(command);
		}